

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTriangles.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TessellationShaderTrianglesDegenerateTriangle::iterate
          (TessellationShaderTrianglesDegenerateTriangle *this)

{
  ostringstream *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  float *value;
  long lVar7;
  MessageBuilder *pMVar8;
  TestError *this_01;
  NotSupportedError *this_02;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  pointer p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  allocator<char> local_1b1;
  undefined1 local_1b0 [384];
  long lVar6;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"Tessellation shader functionality not supported, skipping",
               &local_1b1);
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1b0);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar6 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                  ,0x1a6);
  p_Var12 = (this->m_tests).
            super__Vector_base<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor,_std::allocator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (p_Var12 ==
        (this->m_tests).
        super__Vector_base<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor,_std::allocator<glcts::TessellationShaderTrianglesDegenerateTriangle::_test_descriptor>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    (**(code **)(lVar6 + 0x1680))(p_Var12->po_id);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glUseProgram() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                    ,0x1af);
    (**(code **)(lVar6 + 0x30))(4);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glBeginTransformFeedback(GL_TRIANGLES) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                    ,0x1b3);
    bVar11 = false;
    (**(code **)(lVar6 + 0x538))((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,1);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDrawArrays() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                    ,0x1b6);
    (**(code **)(lVar6 + 0x638))();
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glEndTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                    ,0x1b9);
    value = (float *)(**(code **)(lVar6 + 0xd00))(0x8c8e,0,0x24,1);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glMapBufferRange() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                    ,0x1c0);
    bVar9 = false;
    bVar10 = false;
    for (lVar7 = 8; lVar7 != 0x2c; lVar7 = lVar7 + 0xc) {
      fVar13 = *(float *)((long)value + lVar7 + -8);
      fVar14 = -fVar13;
      if (-fVar13 <= fVar13) {
        fVar14 = fVar13;
      }
      bVar1 = bVar11;
      bVar2 = bVar9;
      if (1e-05 <= fVar14) {
LAB_00cad77a:
        fVar13 = fVar13 + -1.0;
        fVar14 = -fVar13;
        if (-fVar13 <= fVar13) {
          fVar14 = fVar13;
        }
        if (fVar14 < 1e-05) {
          fVar13 = *(float *)((long)value + lVar7 + -4);
          fVar14 = -fVar13;
          if (-fVar13 <= fVar13) {
            fVar14 = fVar13;
          }
          if (fVar14 < 1e-05) {
            fVar13 = *(float *)((long)value + lVar7);
            fVar14 = -fVar13;
            if (-fVar13 <= fVar13) {
              fVar14 = fVar13;
            }
            if (fVar14 < 1e-05) {
              bVar3 = true;
              if (bVar10) {
                this_01 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_01,"(1, 0, 0) vertex outputted more than once",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                           ,0x1ef);
                goto LAB_00cad942;
              }
              goto LAB_00cad7cb;
            }
          }
        }
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Unexpected vertex");
        std::operator<<((ostream *)this_00," (");
        pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
        std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value + 1);
        std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value + 2);
        std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")");
        std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                        " encountered for a degenerate triangle.");
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Invalid vertex was generated by the tessellator",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                   ,0x1f9);
LAB_00cad942:
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      fVar14 = *(float *)((long)value + lVar7 + -4);
      fVar16 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar16 = fVar14;
      }
      bVar3 = bVar10;
      if (1e-05 <= fVar16) {
LAB_00cad746:
        fVar14 = fVar14 + -1.0;
        fVar16 = -fVar14;
        if (-fVar14 <= fVar14) {
          fVar16 = fVar14;
        }
        if (fVar16 < 1e-05) {
          fVar14 = *(float *)((long)value + lVar7);
          fVar16 = -fVar14;
          if (-fVar14 <= fVar14) {
            fVar16 = fVar14;
          }
          if (fVar16 < 1e-05) {
            bVar2 = true;
            if (bVar9) {
              this_01 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_01,"(0, 1, 0) vertex outputted more than once",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                         ,0x1e3);
              goto LAB_00cad942;
            }
            goto LAB_00cad7cb;
          }
        }
        goto LAB_00cad77a;
      }
      fVar15 = *(float *)((long)value + lVar7) + -1.0;
      fVar16 = -fVar15;
      if (-fVar15 <= fVar15) {
        fVar16 = fVar15;
      }
      if (1e-05 <= fVar16) goto LAB_00cad746;
      bVar1 = true;
      if (bVar11) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"(0, 0, 1) vertex outputted more than once",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                   ,0x1d7);
        goto LAB_00cad942;
      }
LAB_00cad7cb:
      bVar10 = bVar3;
      bVar9 = bVar2;
      bVar11 = bVar1;
    }
    (**(code **)(lVar6 + 0x1670))(0x8c8e);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glUnmapBuffer() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                    ,0x1ff);
    p_Var12 = p_Var12 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTrianglesDegenerateTriangle::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize ES test objects */
	initTest();

	/* We only need to use one vertex per so go for it */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname");

	/* Iterate through all tests configured */
	for (_tests_const_iterator test_iterator = m_tests.begin(); test_iterator != m_tests.end(); test_iterator++)
	{
		const _test_descriptor& test = *test_iterator;

		/* Run the iteration */
		gl.useProgram(test.po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed");

		/* Draw the test geometry */
		gl.beginTransformFeedback(GL_TRIANGLES);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback(GL_TRIANGLES) failed.");

		gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, 1 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

		/* Map the BO with result data into user space */
		const float* triangle_vertex_data =
			(const float*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
											sizeof(float) * 3 /* vec3 */ * 3 /* points */, GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed");

		/* Make sure the triangle data is correct. Since we cannot rely on any specific order
		 * of the result vertices, raise corresponding flag for each of the expected vertices.
		 */
		const float epsilon					 = 1e-5f;
		bool		is_zero_zero_one_present = false;
		bool		is_zero_one_zero_present = false;
		bool		is_one_zero_zero_present = false;

		for (unsigned int n_vertex = 0; n_vertex < 3 /* vertices */; ++n_vertex)
		{
			const float* triangle_ptr = triangle_vertex_data + 3 * n_vertex;

			if (de::abs(triangle_ptr[0]) < epsilon && de::abs(triangle_ptr[1]) < epsilon &&
				de::abs(triangle_ptr[2] - 1.0f) < epsilon)
			{
				if (!is_zero_zero_one_present)
				{
					is_zero_zero_one_present = true;
				}
				else
				{
					TCU_FAIL("(0, 0, 1) vertex outputted more than once");
				}
			}
			else if (de::abs(triangle_ptr[0]) < epsilon && de::abs(triangle_ptr[1] - 1.0f) < epsilon &&
					 de::abs(triangle_ptr[2]) < epsilon)
			{
				if (!is_zero_one_zero_present)
				{
					is_zero_one_zero_present = true;
				}
				else
				{
					TCU_FAIL("(0, 1, 0) vertex outputted more than once");
				}
			}
			else if (de::abs(triangle_ptr[0] - 1.0f) < epsilon && de::abs(triangle_ptr[1]) < epsilon &&
					 de::abs(triangle_ptr[2]) < epsilon)
			{
				if (!is_one_zero_zero_present)
				{
					is_one_zero_zero_present = true;
				}
				else
				{
					TCU_FAIL("(1, 0, 0) vertex outputted more than once");
				}
			}
			else
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Unexpected vertex"
								   << " (" << triangle_vertex_data[0] << ", " << triangle_vertex_data[1] << ", "
								   << triangle_vertex_data[2] << ")"
								   << " encountered for a degenerate triangle." << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid vertex was generated by the tessellator");
			}
		} /* for (all vertices) */

		/* Unmap the BO */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed");
	}

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}